

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O1

void RigidBodyDynamics::Math::SparseFactorizeLTL(Model *model,MatrixNd *H)

{
  long lVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double *pdVar5;
  uint uVar6;
  uint uVar7;
  double *pdVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  auVar4 = _DAT_00187220;
  auVar3 = _DAT_00187210;
  uVar13 = (ulong)model->qdot_size;
  if (uVar13 != 0) {
    pdVar5 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar1 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    uVar6 = model->qdot_size - 2;
    pdVar8 = pdVar5 + lVar1;
    pdVar5 = pdVar5 + lVar1 * 2;
    uVar12 = 0;
    uVar10 = uVar6;
    do {
      uVar9 = uVar12 + 1;
      if (uVar9 < uVar13) {
        uVar7 = uVar6 - (int)uVar12;
        auVar15._4_4_ = 0;
        auVar15._0_4_ = uVar7;
        auVar15._8_4_ = uVar7;
        auVar15._12_4_ = 0;
        auVar15 = auVar15 ^ auVar4;
        lVar11 = 0;
        uVar12 = 0;
        do {
          auVar16._8_4_ = (int)uVar12;
          auVar16._0_8_ = uVar12;
          auVar16._12_4_ = (int)(uVar12 >> 0x20);
          auVar16 = (auVar16 | auVar3) ^ auVar4;
          if ((bool)(~(auVar15._4_4_ < auVar16._4_4_ ||
                      auVar15._0_4_ < auVar16._0_4_ && auVar16._4_4_ == auVar15._4_4_) & 1)) {
            *(undefined8 *)((long)pdVar8 + lVar11) = 0;
          }
          if (auVar16._12_4_ <= auVar15._12_4_ &&
              (auVar16._8_4_ <= auVar15._8_4_ || auVar16._12_4_ != auVar15._12_4_)) {
            *(undefined8 *)((long)pdVar5 + lVar11) = 0;
          }
          uVar12 = uVar12 + 2;
          lVar11 = lVar11 + lVar1 * 0x10;
        } while (((ulong)uVar10 + 2 & 0xfffffffffffffffe) != uVar12);
      }
      uVar10 = uVar10 - 1;
      pdVar8 = pdVar8 + lVar1 + 1;
      pdVar5 = pdVar5 + lVar1 + 1;
      uVar12 = uVar9;
    } while (uVar9 != uVar13);
    do {
      uVar12 = uVar13 - 1;
      dVar14 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data[(H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows * uVar12 + (uVar13 - 1)];
      if (dVar14 < 0.0) {
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      pdVar8 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      lVar1 = (H->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      ;
      pdVar8[lVar1 * uVar12 + (uVar13 - 1)] = dVar14;
      puVar2 = (model->lambda_q).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (uVar10 = puVar2[uVar13]; uVar10 != 0; uVar10 = puVar2[uVar10]) {
        lVar11 = (ulong)(uVar10 - 1) * lVar1;
        pdVar8[uVar12 + lVar11] = pdVar8[uVar12 + lVar11] / pdVar8[lVar1 * uVar12 + (uVar13 - 1)];
      }
      for (uVar10 = puVar2[uVar13]; uVar10 != 0; uVar10 = puVar2[uVar10]) {
        uVar9 = (ulong)(uVar10 - 1);
        uVar6 = uVar10;
        do {
          lVar11 = (ulong)(uVar6 - 1) * lVar1;
          pdVar8[lVar11 + uVar9] =
               pdVar8[lVar11 + uVar9] -
               pdVar8[uVar12 + lVar1 * uVar9] * pdVar8[lVar11 + (uVar13 - 1)];
          uVar6 = puVar2[uVar6];
        } while (uVar6 != 0);
      }
      uVar13 = uVar12;
    } while (uVar12 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI void SparseFactorizeLTL (Model &model, Math::MatrixNd &H) {
  for (unsigned int i = 0; i < model.qdot_size; i++) {
    for (unsigned int j = i + 1; j < model.qdot_size; j++) {
      H(i,j) = 0.;
    }
  }

  for (unsigned int k = model.qdot_size; k > 0; k--) {
    H(k - 1,k - 1) = sqrt (H(k - 1,k - 1));
    unsigned int i = model.lambda_q[k];
    while (i != 0) {
      H(k - 1,i - 1) = H(k - 1,i - 1) / H(k - 1,k - 1);
      i = model.lambda_q[i];
    }

    i = model.lambda_q[k];
    while (i != 0) {
      unsigned int j = i;
      while (j != 0) {
        H(i - 1,j - 1) = H(i - 1,j - 1) - H(k - 1,i - 1) * H(k - 1, j - 1);
        j = model.lambda_q[j];
      }
      i = model.lambda_q[i];
    }
  }
}